

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O0

void __thiscall QtMWidgets::TextLabel::setMargin(TextLabel *this,int margin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TextLabelPrivate *pTVar5;
  undefined1 auVar6 [16];
  undefined1 local_24 [8];
  QMargins margins;
  int margin_local;
  TextLabel *this_local;
  
  margins.m_right = margin;
  unique0x1000012f = this;
  pTVar5 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
           ::operator->(&this->d);
  iVar1 = margins.m_right;
  if (pTVar5->margin != margins.m_right) {
    pTVar5 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    pTVar5->margin = iVar1;
    auVar6 = QWidget::contentsMargins();
    margins._0_8_ = auVar6._8_8_;
    local_24 = auVar6._0_8_;
    QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
    ::operator->(&this->d);
    iVar1 = QWidget::width((QWidget *)this);
    iVar2 = QMargins::left((QMargins *)local_24);
    iVar3 = QMargins::right((QMargins *)local_24);
    iVar4 = QFrame::frameWidth();
    pTVar5 = QScopedPointer<QtMWidgets::TextLabelPrivate,_QScopedPointerDeleter<QtMWidgets::TextLabelPrivate>_>
             ::operator->(&this->d);
    QStaticText::setTextWidth
              ((double)(((iVar1 - iVar2) - iVar3) + iVar4 * -2 + pTVar5->margin * -2));
    QWidget::update();
  }
  return;
}

Assistant:

void
TextLabel::setMargin( int margin )
{
	if( d->margin == margin )
		return;

	d->margin = margin;

	const QMargins margins = contentsMargins();

	d->staticText.setTextWidth( width() - margins.left() -
		margins.right() - 2 * frameWidth() - 2 * d->margin );

	update();
}